

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::
CppGeneratorTest_InheritedStringTypeCordNotForExtension_Test::TestBody
          (CppGeneratorTest_InheritedStringTypeCordNotForExtension_Test *this)

{
  string_view name;
  string_view command;
  string_view contents;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n    edition = \"2024\";\n    import \"google/protobuf/cpp_features.proto\";\n    option features.(pb.cpp).string_type = CORD;\n\n    message Foo {\n      extensions 1 to max;\n    }\n    extend Foo {\n      bytes bar = 1;\n    }\n  "
  ;
  contents._M_len = 0xdb;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  command._M_str =
       "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir --experimental_editions foo.proto";
  command._M_len = 0x5a;
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,command);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, InheritedStringTypeCordNotForExtension) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2024";
    import "google/protobuf/cpp_features.proto";
    option features.(pb.cpp).string_type = CORD;

    message Foo {
      extensions 1 to max;
    }
    extend Foo {
      bytes bar = 1;
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir "
      "--experimental_editions foo.proto");

  ExpectNoErrors();
}